

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-mul-mat0.c
# Opt level: O2

_Bool check_gradient(char *op_name,ggml_context *ctx0,ggml_tensor **x,ggml_tensor *f,int ndims,
                    int nargs,float eps,float max_error_abs,float max_error_rel)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  ggml_set_loss(f);
  uVar4 = ggml_new_graph_custom(ctx0,0x800,1);
  ggml_build_forward_expand(uVar4,f);
  uVar5 = ggml_graph_dup(ctx0,uVar4);
  ggml_build_backward_expand(ctx0,ctx0,uVar5,0);
  ggml_graph_compute_with_ctx(ctx0,uVar4,1);
  ggml_graph_reset(uVar5);
  ggml_graph_compute_with_ctx(ctx0,uVar5,1);
  ggml_graph_dump_dot(uVar4,0,"test-grad0-forward.dot");
  ggml_graph_dump_dot(uVar5,uVar4,"test-grad0-backward.dot");
  uVar9 = (ulong)(uint)nargs;
  if (nargs < 1) {
    uVar9 = 0;
  }
  uVar12 = 0;
  do {
    if (uVar12 == uVar9) {
      return true;
    }
    lVar6 = ggml_nelements(x[uVar12]);
    if (lVar6 < 1) {
      lVar6 = 0;
    }
    lVar11 = 0;
    for (lVar8 = 0; lVar6 != lVar8; lVar8 = lVar8 + 1) {
      lVar10 = lVar11 >> 0x1e;
      fVar1 = *(float *)((long)x[uVar12]->data + lVar10);
      *(float *)((long)x[uVar12]->data + lVar10) = fVar1 + eps;
      ggml_graph_compute_with_ctx(ctx0,uVar4,1);
      fVar13 = (float)ggml_get_f32_1d(f,0);
      *(float *)((long)x[uVar12]->data + lVar10) = fVar1 - eps;
      ggml_graph_compute_with_ctx(ctx0,uVar4,1);
      fVar14 = (float)ggml_get_f32_1d(f,0);
      fVar14 = (fVar13 - fVar14) / (eps + eps);
      *(float *)((long)x[uVar12]->data + lVar10) = fVar1;
      ggml_graph_reset(uVar5);
      ggml_graph_compute_with_ctx(ctx0,uVar5,1);
      lVar7 = ggml_graph_get_grad(uVar5,x[uVar12]);
      fVar1 = *(float *)(*(long *)(lVar7 + 0xf8) + lVar10);
      fVar13 = fVar14 - fVar1;
      auVar16._8_4_ = 0x7fffffff;
      auVar16._0_8_ = 0x7fffffff7fffffff;
      auVar16._12_4_ = 0x7fffffff;
      auVar2 = vandps_avx(ZEXT416((uint)fVar13),auVar16);
      auVar15._0_4_ = fVar13 / fVar14;
      auVar15._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar3 = vcmpss_avx(ZEXT416((uint)fVar14),ZEXT416(0),4);
      auVar3 = vandps_avx(auVar3,auVar16);
      auVar3 = vandps_avx(auVar3,auVar15);
      if ((max_error_abs < auVar2._0_4_) || (max_error_rel < auVar3._0_4_)) {
        printf("%s: ndims=%d, i=%d, k=%ld, g0=%f, g1=%f, error_abs=%f, error_rel=%f\n",
               (double)fVar14,(double)fVar1,(double)auVar2._0_4_,(double)auVar3._0_4_,op_name,
               (ulong)(uint)ndims,uVar12 & 0xffffffff,lVar8);
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/tests/test-mul-mat0.c"
                      ,0x91,
                      "_Bool check_gradient(const char *, struct ggml_context *, struct ggml_tensor **, struct ggml_tensor *, int, int, float, float, float)"
                     );
      }
      lVar11 = lVar11 + 0x100000000;
    }
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

bool check_gradient(
        const char * op_name,
        struct ggml_context * ctx0,
        struct ggml_tensor * x[],
        struct ggml_tensor * f,
        int ndims,
        int nargs,
        float eps,
        float max_error_abs,
        float max_error_rel) {
    const int n_threads = 1;
    ggml_set_loss(f);

    struct ggml_cgraph * gf = ggml_new_graph_custom(ctx0, GGML_DEFAULT_GRAPH_SIZE, true);
    ggml_build_forward_expand(gf, f);
    struct ggml_cgraph * gb = ggml_graph_dup(ctx0, gf);
    ggml_build_backward_expand(ctx0, ctx0, gb, false);

    ggml_graph_compute_with_ctx(ctx0, gf, n_threads);
    ggml_graph_reset(gb);
    ggml_graph_compute_with_ctx(ctx0, gb, n_threads);

    ggml_graph_dump_dot(gf, NULL, "test-grad0-forward.dot");
    ggml_graph_dump_dot(gb, gf,   "test-grad0-backward.dot");

    for (int i = 0; i < nargs; ++i) {
        const int64_t nelements = ggml_nelements(x[i]);
        for (int64_t k = 0; k < nelements; ++k) {
            // compute gradient using finite differences
            const float x0 = get_element(x[i], k);

            set_element(x[i], k, x0 + eps);
            ggml_graph_compute_with_ctx(ctx0, gf, n_threads);

            const float f0 = ggml_get_f32_1d(f, 0);

            set_element(x[i], k, x0 - eps);
            ggml_graph_compute_with_ctx(ctx0, gf, n_threads);

            const float f1 = ggml_get_f32_1d(f, 0);

            const float g0 = (f0 - f1)/(2.0f*eps);

            set_element(x[i], k, x0);

            // compute gradient using backward graph
            ggml_graph_reset(gb);
            ggml_graph_compute_with_ctx(ctx0, gb, n_threads);

            const float g1 = get_element(ggml_graph_get_grad(gb, x[i]), k);

            const float error_abs = fabsf(g0 - g1);
            const float error_rel = g0 != 0 ? fabsf(g0 - g1)/fabs(g0) : 0;

            if (error_abs > max_error_abs || error_rel > max_error_rel) {
                printf("%s: ndims=%d, i=%d, k=%" PRId64 ", g0=%f, g1=%f, error_abs=%f, error_rel=%f\n", op_name, ndims, i, k, g0, g1, error_abs, error_rel);
                assert(false);
            }
        }
    }

    return true;
}